

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_text.cpp
# Opt level: O1

int __thiscall FFont::StringWidth(FFont *this,BYTE *string)

{
  BYTE BVar1;
  int iVar2;
  int iVar3;
  BYTE *pBVar4;
  int iVar5;
  
  iVar3 = 0;
  iVar5 = 0;
  while( true ) {
    while( true ) {
      BVar1 = *string;
      if (BVar1 != '\x1c') break;
      pBVar4 = string + 1;
      if (string[1] == '[') {
        for (; (*pBVar4 != '\0' && (*pBVar4 != ']')); pBVar4 = pBVar4 + 1) {
        }
      }
      string = pBVar4 + (*pBVar4 != '\0');
    }
    if (BVar1 == '\0') break;
    if (BVar1 == '\n') {
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
      iVar3 = 0;
    }
    else {
      iVar2 = (*this->_vptr_FFont[3])(this);
      iVar3 = iVar2 + iVar3 + this->GlobalKerning;
    }
    string = string + 1;
  }
  if (iVar3 < iVar5) {
    iVar3 = iVar5;
  }
  return iVar3;
}

Assistant:

int FFont::StringWidth (const BYTE *string) const
{
	int w = 0;
	int maxw = 0;
		
	while (*string)
	{
		if (*string == TEXTCOLOR_ESCAPE)
		{
			++string;
			if (*string == '[')
			{
				while (*string != '\0' && *string != ']')
				{
					++string;
				}
			}
			if (*string != '\0')
			{
				++string;
			}
			continue;
		}
		else if (*string == '\n')
		{
			if (w > maxw)
				maxw = w;
			w = 0;
			++string;
		}
		else
		{
			w += GetCharWidth (*string++) + GlobalKerning;
		}
	}
				
	return MAX (maxw, w);
}